

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luckyFast6.c
# Opt level: O1

word Extra_Truth6ChangePhase(word t,int iVar)

{
  byte bVar1;
  
  if (iVar < 6) {
    bVar1 = (byte)(1 << ((byte)iVar & 0x1f));
    return (Extra_Truth6ChangePhase::Truth6[iVar] & t) >> (bVar1 & 0x3f) |
           (~Extra_Truth6ChangePhase::Truth6[iVar] & t) << (bVar1 & 0x3f);
  }
  __assert_fail("iVar < 6",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bool/lucky/luckyFast6.c"
                ,0x61,"word Extra_Truth6ChangePhase(word, int)");
}

Assistant:

word Extra_Truth6ChangePhase( word t, int iVar)
{
    // elementary truth tables
    static word Truth6[6] = {
        ABC_CONST(0xAAAAAAAAAAAAAAAA),
        ABC_CONST(0xCCCCCCCCCCCCCCCC),
        ABC_CONST(0xF0F0F0F0F0F0F0F0),
        ABC_CONST(0xFF00FF00FF00FF00),
        ABC_CONST(0xFFFF0000FFFF0000),
        ABC_CONST(0xFFFFFFFF00000000)
    };
    assert( iVar < 6 );
    return ((t & ~Truth6[iVar]) << (1 << iVar)) | ((t & Truth6[iVar]) >> (1 << iVar));
}